

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

longlong tinyexr::getBits(int nBits,longlong *c,int *lc,char **in)

{
  long lVar1;
  byte *pbVar2;
  char **in_local;
  int *lc_local;
  longlong *c_local;
  int nBits_local;
  
  while (*lc < nBits) {
    lVar1 = *c;
    pbVar2 = (byte *)*in;
    *in = (char *)(pbVar2 + 1);
    *c = lVar1 << 8 | (ulong)*pbVar2;
    *lc = *lc + 8;
  }
  *lc = *lc - nBits;
  return *c >> ((byte)*lc & 0x3f) & (long)((1 << ((byte)nBits & 0x1f)) + -1);
}

Assistant:

inline long long getBits(int nBits, long long &c, int &lc, const char *&in) {
  while (lc < nBits) {
    c = (c << 8) | *(reinterpret_cast<const unsigned char *>(in++));
    lc += 8;
  }

  lc -= nBits;
  return (c >> lc) & ((1 << nBits) - 1);
}